

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadPolH_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  float *pfVar1;
  _Elt_pointer ppNVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Mesh *__p;
  _Elt_pointer psVar9;
  LineSplitter *splitter_00;
  LineSplitter *pLVar10;
  Logger *this_00;
  LineSplitter *pLVar11;
  byte *pbVar12;
  range_error *this_01;
  ChunkInfo *pCVar13;
  byte *pbVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  byte *pbVar18;
  Node *pNVar19;
  uint uVar20;
  long lVar21;
  size_type __new_size;
  ulong uVar22;
  char *pcVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  LineSplitter *local_78;
  Node *local_70;
  Node *local_68;
  iterator *local_60;
  Type *local_58;
  ChunkInfo *local_50;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  if (8 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"PolH");
    return;
  }
  local_78 = splitter;
  __p = (Mesh *)operator_new(0x158);
  COB::Node::Node((Node *)__p,TYPE_MESH);
  (__p->super_Node)._vptr_Node = (_func_int **)&PTR__Mesh_00810380;
  (__p->texture_coords).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->texture_coords).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->texture_coords).super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->vertex_positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->vertex_positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->vertex_positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->faces).super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->faces).super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->faces).super__Vector_base<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p->draw_flags = 1;
  pCVar13 = (ChunkInfo *)&(__p->temp_map)._M_t._M_impl.super__Rb_tree_header;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pCVar13;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pCVar13;
  (__p->temp_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = (undefined1  [8])__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Mesh*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),__p);
  _Stack_90._M_pi = a_Stack_40[0]._M_pi;
  local_98 = local_48;
  _local_48 = (undefined1  [16])0x0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)local_98);
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  pLVar10 = local_78;
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  psVar9 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar9 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar13 = (ChunkInfo *)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar9 = (_Elt_pointer)(*(long *)&pCVar13[-1].version + 0x200);
  }
  pNVar19 = psVar9[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar24 = nfo->parent_id;
  uVar25 = nfo->version;
  uVar20 = nfo->size;
  (pNVar19->super_ChunkInfo).id = nfo->id;
  (pNVar19->super_ChunkInfo).parent_id = uVar24;
  (pNVar19->super_ChunkInfo).version = uVar25;
  (pNVar19->super_ChunkInfo).size = uVar20;
  pLVar11 = pLVar10;
  splitter_00 = LineSplitter::operator++(pLVar10);
  local_68 = pNVar19;
  ReadBasicNodeInfo_Ascii((COBImporter *)pLVar11,pNVar19,splitter_00,pCVar13);
  if (*(int *)&pLVar10->mStream->end == *(int *)&pLVar10->mStream->current) {
    return;
  }
  local_58 = &local_68[1].type;
  local_70 = local_68 + 1;
  local_60 = &local_68[1].temp_children.
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start;
  local_50 = nfo;
LAB_004c3a72:
  uVar15 = (pLVar10->mCur)._M_string_length;
  if (uVar15 < 0xe) {
    if (4 < uVar15) goto LAB_004c3ada;
  }
  else {
    pbVar18 = (byte *)(pLVar10->mCur)._M_dataplus._M_p;
    if (*(long *)(pbVar18 + 6) == 0x7365636974726556 && *(long *)pbVar18 == 0x655620646c726f57) {
      while( true ) {
        bVar16 = *pbVar18;
        uVar15 = (ulong)bVar16;
        if ((bVar16 != 9) && (bVar16 != 0x20)) break;
        pbVar18 = pbVar18 + 1;
      }
      lVar21 = 0;
      pbVar12 = pbVar18;
      do {
        while (pbVar14 = pbVar12 + 1, 0x20 < (byte)uVar15) {
LAB_004c3b59:
          pbVar12 = pbVar18 + 1;
          pbVar18 = pbVar18 + 1;
          uVar15 = (ulong)*pbVar12;
          pbVar12 = pbVar14;
        }
        if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_004c3b59;
          this_01 = (range_error *)__cxa_allocate_exception(0x10);
          std::range_error::range_error(this_01,"Token index out of range, EOL reached");
          goto LAB_004c437d;
        }
        while (((char)uVar15 == ' ' || ((int)uVar15 == 9))) {
          pbVar12 = pbVar18 + 1;
          pbVar18 = pbVar18 + 1;
          pbVar14 = pbVar14 + 1;
          uVar15 = (ulong)*pbVar12;
        }
        lVar21 = lVar21 + 1;
        pbVar12 = pbVar18;
      } while (lVar21 != 2);
      if ((byte)((char)uVar15 - 0x3aU) < 0xf6) {
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_58,0);
      }
      else {
        uVar22 = 0;
        do {
          uVar24 = (uint)(byte)((char)uVar15 - 0x30) + (int)uVar22 * 10;
          uVar22 = (ulong)uVar24;
          bVar16 = *pbVar14;
          uVar15 = (ulong)bVar16;
          pbVar14 = pbVar14 + 1;
        } while (0xf5 < (byte)(bVar16 - 0x3a));
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_58,uVar22
                  );
        if (uVar24 != 0) {
          uVar15 = 0;
          do {
            pLVar11 = LineSplitter::operator++(pLVar10);
            if (*(int *)&pLVar11->mStream->end == *(int *)&pLVar11->mStream->current) break;
            for (pcVar23 = (pLVar10->mCur)._M_dataplus._M_p; (*pcVar23 == ' ' || (*pcVar23 == '\t'))
                ; pcVar23 = pcVar23 + 1) {
            }
            pfVar1 = (float *)(*(long *)local_58 + uVar15 * 0xc);
            auVar4._12_4_ = 0;
            auVar4._0_12_ = stack0xffffffffffffff6c;
            _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)
                        (auVar4 << 0x20);
            pcVar23 = fast_atoreal_move<float>(pcVar23,(float *)local_98,true);
            *pfVar1 = (float)local_98._0_4_;
            for (; (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
            }
            auVar5._12_4_ = 0;
            auVar5._0_12_ = stack0xffffffffffffff6c;
            _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)
                        (auVar5 << 0x20);
            pcVar23 = fast_atoreal_move<float>(pcVar23,(float *)local_98,true);
            pfVar1[1] = (float)local_98._0_4_;
            for (; (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
            }
            auVar6._12_4_ = 0;
            auVar6._0_12_ = stack0xffffffffffffff6c;
            _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)
                        (auVar6 << 0x20);
            fast_atoreal_move<float>(pcVar23,(float *)local_98,true);
            pfVar1[2] = (float)local_98._0_4_;
            uVar15 = uVar15 + 1;
            pLVar10 = local_78;
          } while (uVar15 != uVar22);
        }
      }
    }
    else {
      if (0xf < uVar15) {
        pbVar18 = (byte *)(pLVar10->mCur)._M_dataplus._M_p;
        auVar26[0] = -(*pbVar18 == 0x54);
        auVar26[1] = -(pbVar18[1] == 0x65);
        auVar26[2] = -(pbVar18[2] == 0x78);
        auVar26[3] = -(pbVar18[3] == 0x74);
        auVar26[4] = -(pbVar18[4] == 0x75);
        auVar26[5] = -(pbVar18[5] == 0x72);
        auVar26[6] = -(pbVar18[6] == 0x65);
        auVar26[7] = -(pbVar18[7] == 0x20);
        auVar26[8] = -(pbVar18[8] == 0x56);
        auVar26[9] = -(pbVar18[9] == 0x65);
        auVar26[10] = -(pbVar18[10] == 0x72);
        auVar26[0xb] = -(pbVar18[0xb] == 0x74);
        auVar26[0xc] = -(pbVar18[0xc] == 0x69);
        auVar26[0xd] = -(pbVar18[0xd] == 99);
        auVar26[0xe] = -(pbVar18[0xe] == 0x65);
        auVar26[0xf] = -(pbVar18[0xf] == 0x73);
        if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
          while( true ) {
            bVar16 = *pbVar18;
            uVar15 = (ulong)bVar16;
            if ((bVar16 != 9) && (bVar16 != 0x20)) break;
            pbVar18 = pbVar18 + 1;
          }
          lVar21 = 0;
          pbVar12 = pbVar18;
          do {
            while (pbVar14 = pbVar12 + 1, 0x20 < (byte)uVar15) {
LAB_004c3bcc:
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              uVar15 = (ulong)*pbVar12;
              pbVar12 = pbVar14;
            }
            if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_004c3bcc;
              this_01 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_01,"Token index out of range, EOL reached");
              goto LAB_004c437d;
            }
            while (((char)uVar15 == ' ' || ((int)uVar15 == 9))) {
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              pbVar14 = pbVar14 + 1;
              uVar15 = (ulong)*pbVar12;
            }
            lVar21 = lVar21 + 1;
            pbVar12 = pbVar18;
          } while (lVar21 != 2);
          if ((byte)((char)uVar15 - 0x3aU) < 0xf6) {
            std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                      ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70,0)
            ;
          }
          else {
            uVar22 = 0;
            do {
              uVar24 = (uint)(byte)((char)uVar15 - 0x30) + (int)uVar22 * 10;
              uVar22 = (ulong)uVar24;
              bVar16 = *pbVar14;
              uVar15 = (ulong)bVar16;
              pbVar14 = pbVar14 + 1;
            } while (0xf5 < (byte)(bVar16 - 0x3a));
            std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                      ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_70,
                       uVar22);
            if (uVar24 != 0) {
              uVar15 = 0;
              do {
                pLVar11 = LineSplitter::operator++(pLVar10);
                if (*(int *)&pLVar11->mStream->end == *(int *)&pLVar11->mStream->current) break;
                pp_Var3 = local_70->_vptr_Node;
                for (pcVar23 = (pLVar10->mCur)._M_dataplus._M_p;
                    (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
                }
                auVar7._12_4_ = 0;
                auVar7._0_12_ = stack0xffffffffffffff6c;
                _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)
                            (auVar7 << 0x20);
                pcVar23 = fast_atoreal_move<float>(pcVar23,(float *)local_98,true);
                *(undefined4 *)(pp_Var3 + uVar15) = local_98._0_4_;
                for (; (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
                }
                auVar8._12_4_ = 0;
                auVar8._0_12_ = stack0xffffffffffffff6c;
                _local_98 = (__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)
                            (auVar8 << 0x20);
                fast_atoreal_move<float>(pcVar23,(float *)local_98,true);
                *(undefined4 *)((long)pp_Var3 + uVar15 * 8 + 4) = local_98._0_4_;
                uVar15 = uVar15 + 1;
                pLVar10 = local_78;
              } while (uVar15 != uVar22);
            }
          }
          goto LAB_004c3ffa;
        }
      }
LAB_004c3ada:
      pbVar18 = (byte *)(pLVar10->mCur)._M_dataplus._M_p;
      pbVar12 = pbVar18;
      if (pbVar18[4] == 0x73 && *(int *)pbVar18 == 0x65636146) {
        while( true ) {
          pbVar12 = pbVar12 + 1;
          bVar16 = *pbVar18;
          if ((bVar16 != 9) && (bVar16 != 0x20)) break;
          pbVar18 = pbVar18 + 1;
        }
        do {
          uVar15 = (ulong)bVar16;
          if (bVar16 < 0x21) {
            if ((0x100000200U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_004c3c57;
            if ((0x3401UL >> (uVar15 & 0x3f) & 1) != 0) {
              this_01 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_01,"Token index out of range, EOL reached");
              goto LAB_004c437d;
            }
          }
          bVar16 = pbVar18[1];
          pbVar18 = pbVar18 + 1;
          pbVar12 = pbVar12 + 1;
        } while( true );
      }
      if ((8 < uVar15) &&
         (pbVar18 = (byte *)(pLVar10->mCur)._M_dataplus._M_p,
         pbVar18[8] == 0x73 && *(long *)pbVar18 == 0x67616c4677617244)) {
        do {
          do {
            pbVar12 = pbVar18 + 1;
            bVar16 = *pbVar18;
            pbVar18 = pbVar12;
          } while (bVar16 == 9);
        } while (bVar16 == 0x20);
        do {
          uVar15 = (ulong)bVar16;
          if (bVar16 < 0x21) {
            if ((0x100000200U >> (uVar15 & 0x3f) & 1) != 0) {
              while (((char)uVar15 == ' ' || ((int)uVar15 == 9))) {
                bVar16 = *pbVar12;
                pbVar12 = pbVar12 + 1;
                uVar15 = (ulong)bVar16;
              }
              iVar17 = 0;
              if (0xf5 < (byte)((char)uVar15 - 0x3aU)) {
                iVar17 = 0;
                do {
                  iVar17 = (uint)(byte)((char)uVar15 - 0x30) + iVar17 * 10;
                  bVar16 = *pbVar12;
                  uVar15 = (ulong)bVar16;
                  pbVar12 = pbVar12 + 1;
                } while (0xf5 < (byte)(bVar16 - 0x3a));
              }
              *(int *)&local_68[1].temp_children.
                       super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_node = iVar17;
              return;
            }
            if ((0x3401UL >> (uVar15 & 0x3f) & 1) != 0) {
              this_01 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_01,"Token index out of range, EOL reached");
LAB_004c437d:
              __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
            }
          }
          bVar16 = *pbVar12;
          pbVar12 = pbVar12 + 1;
        } while( true );
      }
    }
  }
  goto LAB_004c3ffa;
LAB_004c3c57:
  while (((char)uVar15 == ' ' || ((int)uVar15 == 9))) {
    pbVar14 = pbVar18 + 1;
    pbVar18 = pbVar18 + 1;
    pbVar12 = pbVar12 + 1;
    uVar15 = (ulong)*pbVar14;
  }
  if ((byte)((char)uVar15 - 0x3aU) < 0xf6) {
    std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
              ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_60,0);
  }
  else {
    uVar24 = 0;
    do {
      uVar24 = (uint)(byte)((char)uVar15 - 0x30) + uVar24 * 10;
      bVar16 = *pbVar12;
      uVar15 = (ulong)bVar16;
      pbVar12 = pbVar12 + 1;
    } while (0xf5 < (byte)(bVar16 - 0x3a));
    std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
              ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_60,
               (ulong)uVar24);
    if (uVar24 != 0) {
      uVar25 = 0;
      do {
        pLVar10 = LineSplitter::operator++(local_78);
        if (*(int *)&pLVar10->mStream->end == *(int *)&pLVar10->mStream->current) break;
        if ((local_78->mCur)._M_string_length < 4) {
LAB_004c43ff:
          local_98 = (undefined1  [8])&local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Expected Face line","");
          ThrowException((string *)local_98);
        }
        if (*(int *)(local_78->mCur)._M_dataplus._M_p == 0x656c6f48) {
          this_00 = DefaultLogger::get();
          Logger::warn(this_00,"Skipping unsupported `Hole` line");
        }
        else {
          if (*(int *)(local_78->mCur)._M_dataplus._M_p != 0x65636146) goto LAB_004c43ff;
          local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )0x0;
          local_98 = (undefined1  [8])0x0;
          _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::
          emplace_back<Assimp::COB::Face>
                    ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_60,
                     (Face *)local_98);
          if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            operator_delete(_Stack_90._M_pi,local_88._8_8_ - (long)_Stack_90._M_pi);
          }
          ppNVar2 = local_68[1].temp_children.
                    super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
          pbVar18 = (byte *)(local_78->mCur)._M_dataplus._M_p;
          while( true ) {
            bVar16 = *pbVar18;
            uVar15 = (ulong)bVar16;
            if ((bVar16 != 9) && (bVar16 != 0x20)) break;
            pbVar18 = pbVar18 + 1;
          }
          lVar21 = 0;
          pbVar12 = pbVar18;
          do {
            while (pbVar14 = pbVar12 + 1, 0x20 < (byte)uVar15) {
LAB_004c3d79:
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              uVar15 = (ulong)*pbVar12;
              pbVar12 = pbVar14;
            }
            if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_004c3d79;
              this_01 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_01,"Token index out of range, EOL reached");
              goto LAB_004c437d;
            }
            while (((char)uVar15 == ' ' || ((int)uVar15 == 9))) {
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              pbVar14 = pbVar14 + 1;
              uVar15 = (ulong)*pbVar12;
            }
            lVar21 = lVar21 + 1;
            pbVar12 = pbVar18;
          } while (lVar21 != 2);
          if ((byte)((char)uVar15 - 0x3aU) < 0xf6) {
            __new_size = 0;
          }
          else {
            uVar20 = 0;
            do {
              uVar20 = (uint)(byte)((char)uVar15 - 0x30) + uVar20 * 10;
              bVar16 = *pbVar14;
              uVar15 = (ulong)bVar16;
              pbVar14 = pbVar14 + 1;
            } while (0xf5 < (byte)(bVar16 - 0x3a));
            __new_size = (size_type)uVar20;
          }
          std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::resize
                    ((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
                     (ppNVar2 + -3),__new_size);
          pbVar18 = (byte *)(local_78->mCur)._M_dataplus._M_p;
          while( true ) {
            bVar16 = *pbVar18;
            uVar15 = (ulong)bVar16;
            if ((bVar16 != 9) && (bVar16 != 0x20)) break;
            pbVar18 = pbVar18 + 1;
          }
          lVar21 = 0;
          pbVar12 = pbVar18;
          do {
            while (pbVar14 = pbVar12 + 1, 0x20 < (byte)uVar15) {
LAB_004c3e24:
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              uVar15 = (ulong)*pbVar12;
              pbVar12 = pbVar14;
            }
            if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_004c3e24;
              this_01 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_01,"Token index out of range, EOL reached");
              goto LAB_004c437d;
            }
            while (((char)uVar15 == ' ' || ((int)uVar15 == 9))) {
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              pbVar14 = pbVar14 + 1;
              uVar15 = (ulong)*pbVar12;
            }
            lVar21 = lVar21 + 1;
            pbVar12 = pbVar18;
          } while (lVar21 != 4);
          iVar17 = 0;
          if (0xf5 < (byte)((char)uVar15 - 0x3aU)) {
            iVar17 = 0;
            do {
              iVar17 = (uint)(byte)((char)uVar15 - 0x30) + iVar17 * 10;
              bVar16 = *pbVar14;
              uVar15 = (ulong)bVar16;
              pbVar14 = pbVar14 + 1;
            } while (0xf5 < (byte)(bVar16 - 0x3a));
          }
          *(int *)((long)ppNVar2 + -0x1c) = iVar17;
          pbVar18 = (byte *)(local_78->mCur)._M_dataplus._M_p;
          while( true ) {
            bVar16 = *pbVar18;
            uVar15 = (ulong)bVar16;
            if ((bVar16 != 9) && (bVar16 != 0x20)) break;
            pbVar18 = pbVar18 + 1;
          }
          lVar21 = 0;
          pbVar12 = pbVar18;
          do {
            while (pbVar14 = pbVar12 + 1, 0x20 < (byte)uVar15) {
LAB_004c3eaf:
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              uVar15 = (ulong)*pbVar12;
              pbVar12 = pbVar14;
            }
            if ((0x100000200U >> (uVar15 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar15 & 0x3f) & 1) == 0) goto LAB_004c3eaf;
              this_01 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_01,"Token index out of range, EOL reached");
              goto LAB_004c437d;
            }
            while (((char)uVar15 == ' ' || ((int)uVar15 == 9))) {
              pbVar12 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              pbVar14 = pbVar14 + 1;
              uVar15 = (ulong)*pbVar12;
            }
            lVar21 = lVar21 + 1;
            pbVar12 = pbVar18;
          } while (lVar21 != 6);
          iVar17 = 0;
          if (0xf5 < (byte)((char)uVar15 - 0x3aU)) {
            iVar17 = 0;
            do {
              iVar17 = (uint)(byte)((char)uVar15 - 0x30) + iVar17 * 10;
              bVar16 = *pbVar14;
              uVar15 = (ulong)bVar16;
              pbVar14 = pbVar14 + 1;
            } while (0xf5 < (byte)(bVar16 - 0x3a));
          }
          *(int *)(ppNVar2 + -4) = iVar17;
          pLVar10 = LineSplitter::operator++(local_78);
          pNVar19 = ppNVar2[-3];
          if (ppNVar2[-2] != pNVar19) {
            uVar15 = 0;
            pbVar18 = (byte *)(pLVar10->mCur)._M_dataplus._M_p;
            do {
              do {
                pbVar12 = pbVar18 + 1;
                uVar22 = (ulong)*pbVar18;
                if (0x3c < uVar22) {
LAB_004c433a:
                  local_98 = (undefined1  [8])&local_88;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_98,"Expected < token in Face entry","");
                  ThrowException((string *)local_98);
                }
                pbVar18 = pbVar12;
              } while ((0x100000200U >> (uVar22 & 0x3f) & 1) != 0);
              if (uVar22 != 0x3c) {
                if ((0x3401UL >> (uVar22 & 0x3f) & 1) != 0) {
                  local_98 = (undefined1  [8])&local_88;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_98,"Expected EOL token in Face entry","");
                  ThrowException((string *)local_98);
                }
                goto LAB_004c433a;
              }
              bVar16 = *pbVar12;
              iVar17 = 0;
              if (0xf5 < (byte)(bVar16 - 0x3a)) {
                iVar17 = 0;
                do {
                  iVar17 = (uint)(byte)(bVar16 - 0x30) + iVar17 * 10;
                  bVar16 = pbVar12[1];
                  pbVar12 = pbVar12 + 1;
                } while (0xf5 < (byte)(bVar16 - 0x3a));
              }
              *(int *)(&pNVar19->_vptr_Node + uVar15) = iVar17;
              if (*pbVar12 != 0x2c) {
                local_98 = (undefined1  [8])&local_88;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"Expected , token in Face entry","");
                ThrowException((string *)local_98);
              }
              bVar16 = pbVar12[1];
              pbVar12 = pbVar12 + 1;
              uVar20 = 0;
              if (0xf5 < (byte)(bVar16 - 0x3a)) {
                uVar20 = 0;
                do {
                  uVar20 = (uint)(byte)(bVar16 - 0x30) + uVar20 * 10;
                  bVar16 = pbVar12[1];
                  pbVar12 = pbVar12 + 1;
                } while (0xf5 < (byte)(bVar16 - 0x3a));
              }
              (((vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *)
               (ppNVar2 + -3))->
              super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar15].uv_idx = uVar20;
              if (*pbVar12 != 0x3e) {
                local_98 = (undefined1  [8])&local_88;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"Expected < token in Face entry","");
                ThrowException((string *)local_98);
              }
              pbVar18 = pbVar12 + 1;
              uVar15 = uVar15 + 1;
              pNVar19 = ppNVar2[-3];
            } while (uVar15 < (ulong)((long)ppNVar2[-2] - (long)pNVar19 >> 3));
          }
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar24);
    }
  }
  pLVar10 = local_78;
  if (local_50->version < 5) {
    return;
  }
LAB_004c3ffa:
  LineSplitter::operator++(pLVar10);
  if (*(int *)&pLVar10->mStream->end == *(int *)&pLVar10->mStream->current) {
    return;
  }
  goto LAB_004c3a72;
}

Assistant:

void COBImporter::ReadPolH_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"PolH");
    }

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    // the chunk has a fixed order of components, but some are not interesting of us so
    // we're just looking for keywords in arbitrary order. The end of the chunk is
    // either the last `Face` or the `DrawFlags` attribute, depending on the format ver.
    for(;splitter;++splitter) {
        if (splitter.match_start("World Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.vertex_positions.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector3D& v = msh.vertex_positions[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
                SkipSpaces(&s);
                v.z = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Texture Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.texture_coords.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector2D& v = msh.texture_coords[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Faces")) {
            const unsigned int cnt = strtoul10(splitter[1]);
            msh.faces.reserve(cnt);

            for(unsigned int cur = 0; cur < cnt && ++splitter ;++cur) {
                if (splitter.match_start("Hole")) {
                    ASSIMP_LOG_WARN( "Skipping unsupported `Hole` line" );
                    continue;
                }

                if (!splitter.match_start("Face")) {
                    ThrowException("Expected Face line");
                }

                msh.faces.push_back(Face());
                Face& face = msh.faces.back();

                face.indices.resize(strtoul10(splitter[2]));
                face.flags = strtoul10(splitter[4]);
                face.material = strtoul10(splitter[6]);

                const char* s = (++splitter)->c_str();
                for(size_t i = 0; i < face.indices.size(); ++i) {
                    if(!SkipSpaces(&s)) {
                        ThrowException("Expected EOL token in Face entry");
                    }
                    if ('<' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                    face.indices[i].pos_idx = strtoul10(s,&s);
                    if (',' != *s++) {
                        ThrowException("Expected , token in Face entry");
                    }
                    face.indices[i].uv_idx = strtoul10(s,&s);
                    if ('>' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                }
            }
            if (nfo.version <= 4) {
                break;
            }
        }
        else if (splitter.match_start("DrawFlags")) {
            msh.draw_flags = strtoul10(splitter[1]);
            break;
        }
    }
}